

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::HashTable
          (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *this,ArenaAllocator *allocator,
          uint tableSize)

{
  DictionaryStats *pDVar1;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  pDVar1 = DictionaryStats::Create
                     ("P9HashTableIPN2IR10LabelInstrEN6Memory14ArenaAllocatorEE",tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

HashTable(TAllocator * allocator, DECLSPEC_GUARD_OVERFLOW uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }